

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implementation.hpp
# Opt level: O1

void __thiscall
boost::unordered::detail::
table<boost::unordered::detail::map<std::allocator<std::pair<const_int,_boost::tuples::tuple<bool,_unsigned_int,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>_>,_int,_boost::tuples::tuple<bool,_unsigned_int,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>,_boost::hash<int>,_std::equal_to<int>_>_>
::reserve_for_insert
          (table<boost::unordered::detail::map<std::allocator<std::pair<const_int,_boost::tuples::tuple<bool,_unsigned_int,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>_>,_int,_boost::tuples::tuple<bool,_unsigned_int,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>,_boost::hash<int>,_std::equal_to<int>_>_>
           *this,size_t size)

{
  bucket_pointer ppVar1;
  bool bVar2;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  link_pointer ppVar6;
  link_pointer ppVar7;
  link_pointer ppVar8;
  
  if (this->buckets_ == (bucket_pointer)0x0) {
    sVar4 = min_buckets_for_size(this,size);
    uVar3 = this->bucket_count_;
    if (this->bucket_count_ <= sVar4) {
      uVar3 = sVar4;
    }
    create_buckets(this,uVar3);
    return;
  }
  if (this->max_load_ < size) {
    uVar3 = (this->size_ >> 1) + this->size_;
    if (uVar3 <= size) {
      uVar3 = size;
    }
    sVar4 = min_buckets_for_size(this,uVar3);
    if (sVar4 != this->bucket_count_) {
      if (this->buckets_ == (bucket_pointer)0x0) {
        __assert_fail("this->buckets_",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/unordered/detail/implementation.hpp"
                      ,0x1156,
                      "void boost::unordered::detail::table<boost::unordered::detail::map<std::allocator<std::pair<const int, boost::tuples::tuple<bool, unsigned int>>>, int, boost::tuples::tuple<bool, unsigned int>, boost::hash<int>, std::equal_to<int>>>::rehash_impl(std::size_t) [Types = boost::unordered::detail::map<std::allocator<std::pair<const int, boost::tuples::tuple<bool, unsigned int>>>, int, boost::tuples::tuple<bool, unsigned int>, boost::hash<int>, std::equal_to<int>>]"
                     );
      }
      create_buckets(this,sVar4);
      ppVar1 = this->buckets_;
      if (ppVar1 == (bucket_pointer)0x0) {
        __assert_fail("buckets_",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/unordered/detail/implementation.hpp"
                      ,0xb8c,
                      "bucket_pointer boost::unordered::detail::table<boost::unordered::detail::map<std::allocator<std::pair<const int, boost::tuples::tuple<bool, unsigned int>>>, int, boost::tuples::tuple<bool, unsigned int>, boost::hash<int>, std::equal_to<int>>>::get_bucket(std::size_t) const [Types = boost::unordered::detail::map<std::allocator<std::pair<const int, boost::tuples::tuple<bool, unsigned int>>>, int, boost::tuples::tuple<bool, unsigned int>, boost::hash<int>, std::equal_to<int>>]"
                     );
      }
      uVar3 = this->bucket_count_;
      ppVar7 = ppVar1[uVar3].next_;
      if (ppVar7 != (link_pointer)0x0) {
        ppVar6 = ppVar1 + uVar3;
        do {
          uVar5 = (ulong)(long)*(int *)&ppVar7[2].next_ % uVar3;
          ppVar7[1].next_ = (link_pointer)(uVar5 & 0x7fffffffffffffff);
          do {
            ppVar8 = ppVar7->next_;
            if ((ppVar8 == (link_pointer)0x0) || (-1 < (long)ppVar8[1].next_)) {
              bVar2 = false;
              ppVar8 = ppVar7;
            }
            else {
              ppVar8[1].next_ = (link_pointer)(uVar5 | 0x8000000000000000);
              bVar2 = true;
            }
            ppVar7 = ppVar8;
          } while (bVar2);
          if (ppVar1[uVar5].next_ == (link_pointer)0x0) {
            ppVar1[uVar5].next_ = ppVar6;
            ppVar6 = ppVar8;
          }
          else {
            ppVar7 = ppVar8->next_;
            ppVar8->next_ = (ppVar1[uVar5].next_)->next_;
            (ppVar1[uVar5].next_)->next_ = ppVar6->next_;
            ppVar6->next_ = ppVar7;
          }
          ppVar7 = ppVar6->next_;
        } while (ppVar7 != (link_pointer)0x0);
      }
    }
  }
  return;
}

Assistant:

inline void table<Types>::reserve_for_insert(std::size_t size)
      {
        if (!buckets_) {
          create_buckets((std::max)(bucket_count_, min_buckets_for_size(size)));
        } else if (size > max_load_) {
          std::size_t num_buckets =
            min_buckets_for_size((std::max)(size, size_ + (size_ >> 1)));

          if (num_buckets != bucket_count_)
            this->rehash_impl(num_buckets);
        }
      }